

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O1

PAL_ERROR __thiscall
CorUnix::CPalSynchronizationManager::CreateSynchStateController
          (CPalSynchronizationManager *this,CPalThread *pthrCurrent,CObjectType *potObjectType,
          VOID *pvSynchData,ObjectDomain odObjectDomain,ISynchStateController **ppStateController)

{
  ISynchStateController IVar1;
  PAL_ERROR PVar2;
  ISynchStateController local_50;
  CSynchStateController *pObj;
  CObjectType *local_40;
  ObjectDomain local_38;
  byte local_31;
  
  local_31 = odObjectDomain == SharedObject;
  pObj = (CSynchStateController *)ppStateController;
  local_40 = potObjectType;
  local_38 = odObjectDomain;
  if ((bool)local_31) {
    pvSynchData = SHMPtrToPtr((SHMPTR)pvSynchData);
  }
  local_50._vptr_ISynchStateController = (_func_int **)0x0;
  CSynchCache<CorUnix::CSynchStateController>::Get
            (&this->m_cacheStateCtrlrs,pthrCurrent,1,(CSynchStateController **)&local_50);
  IVar1._vptr_ISynchStateController = local_50._vptr_ISynchStateController;
  if (local_50._vptr_ISynchStateController == (_func_int **)0x0) {
    PVar2 = 8;
  }
  else {
    CSynchControllerBase::Init
              ((CSynchControllerBase *)(local_50._vptr_ISynchStateController + 1),pthrCurrent,
               StateController,local_38,local_40,(CSynchData *)pvSynchData,(uint)local_31 * 2);
    (pObj->super_ISynchStateController)._vptr_ISynchStateController =
         IVar1._vptr_ISynchStateController;
    PVar2 = 0;
  }
  return PVar2;
}

Assistant:

PAL_ERROR CPalSynchronizationManager::CreateSynchStateController(
        CPalThread *pthrCurrent,
        CObjectType *potObjectType,
        VOID *pvSynchData,
        ObjectDomain odObjectDomain,
        ISynchStateController **ppStateController)
    {
        PAL_ERROR palErr = NO_ERROR;
        CSynchStateController * pCtrlr =  NULL;
        WaitDomain wdWaitDomain = (SharedObject == odObjectDomain) ? SharedWait : LocalWait;
        CSynchData * psdSynchData;

        psdSynchData = (SharedObject == odObjectDomain) ? SharedIDToTypePointer(
            CSynchData, reinterpret_cast<SharedID>(pvSynchData)) :
            static_cast<CSynchData *>(pvSynchData);

        VALIDATEOBJECT(psdSynchData);

        pCtrlr = m_cacheStateCtrlrs.Get(pthrCurrent);
        if (NULL == pCtrlr)
        {
            palErr = ERROR_NOT_ENOUGH_MEMORY;
            goto CSSC_exit;
        }

        pCtrlr->Init(pthrCurrent,
                     CSynchControllerBase::StateController,
                     odObjectDomain,
                     potObjectType,
                     psdSynchData,
                     wdWaitDomain);

        // Succeeded
        *ppStateController = (ISynchStateController *)pCtrlr;

    CSSC_exit:
        if ((NO_ERROR != palErr) && (NULL != pCtrlr))
        {
            m_cacheStateCtrlrs.Add(pthrCurrent, pCtrlr);
        }
        return palErr;
    }